

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int pushresult(lua_State *L,int i,char *filename)

{
  int __errnum;
  int *piVar1;
  char *pcVar2;
  int en;
  char *filename_local;
  int i_local;
  lua_State *L_local;
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  if (i == 0) {
    lua_pushnil(L);
    if (filename == (char *)0x0) {
      pcVar2 = strerror(__errnum);
      lua_pushfstring(L,"%s",pcVar2);
    }
    else {
      pcVar2 = strerror(__errnum);
      lua_pushfstring(L,"%s: %s",filename,pcVar2);
    }
    lua_pushinteger(L,(long)__errnum);
    L_local._4_4_ = 3;
  }
  else {
    lua_pushboolean(L,1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int pushresult (lua_State *L, int i, const char *filename) {
  int en = errno;  /* calls to Lua API may change this value */
  if (i) {
    lua_pushboolean(L, 1);
    return 1;
  }
  else {
    lua_pushnil(L);
    if (filename)
      lua_pushfstring(L, "%s: %s", filename, strerror(en));
    else
      lua_pushfstring(L, "%s", strerror(en));
    lua_pushinteger(L, en);
    return 3;
  }
}